

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5PreciseQualifier.cpp
# Opt level: O3

IterateResult __thiscall
glcts::GPUShader5PreciseQualifier::iterate(GPUShader5PreciseQualifier *this)

{
  float fVar1;
  float fVar2;
  GLuint GVar3;
  char *description;
  int iVar4;
  qpTestResult testResult;
  TestContext *this_00;
  long lVar5;
  long lVar6;
  GLfloat vertex_data_weights [4];
  GLfloat vertex_data_positions [4];
  WeightedSum weighted_sum_backward [4];
  WeightedSum weighted_sum_forward [4];
  float local_7c;
  float local_78;
  ulong local_74;
  float local_6c;
  float local_68;
  ulong local_64;
  float local_5c;
  WeightedSum local_58;
  uint local_54;
  uint local_50;
  WeightedSum local_48;
  uint local_44;
  uint local_40;
  
  initTest(this);
  TestCaseBase::randomSeed(&this->super_TestCaseBase,1);
  iVar4 = 0;
  while( true ) {
    GVar3 = TestCaseBase::randomFormula(&this->super_TestCaseBase,2000);
    local_68 = (float)(int)(GVar3 - 1000);
    local_7c = 1.0;
    lVar5 = 0;
    do {
      GVar3 = TestCaseBase::randomFormula(&this->super_TestCaseBase,1000);
      local_7c = local_7c - (float)GVar3 / 1000.0;
      (&local_78)[lVar5] = (float)GVar3 / 1000.0;
      lVar6 = lVar5 + 1;
      GVar3 = TestCaseBase::randomFormula(&this->super_TestCaseBase,2000);
      *(float *)((long)&local_64 + lVar5 * 4) = (float)(int)(GVar3 - 1000);
      lVar5 = lVar6;
    } while (lVar6 != 3);
    local_6c = local_7c;
    drawAndGetFeedbackResult(this,&local_68,&local_78,&local_48);
    fVar2 = local_68;
    fVar1 = local_78;
    local_68 = local_5c;
    local_5c = fVar2;
    local_64 = local_64 << 0x20 | local_64 >> 0x20;
    local_78 = local_6c;
    local_6c = fVar1;
    local_74 = local_74 << 0x20 | local_74 >> 0x20;
    drawAndGetFeedbackResult(this,&local_68,&local_78,&local_58);
    if ((((local_58.intv != local_54) || (local_58.intv != local_50)) ||
        (local_58.intv != local_48.intv)) ||
       ((local_58.intv != local_44 || (local_58.intv != local_40)))) break;
    iVar4 = iVar4 + 1;
    if (iVar4 == 100) {
      this_00 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
LAB_00d246c8:
      tcu::TestContext::setTestResult(this_00,testResult,description);
      return STOP;
    }
  }
  this_00 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
  description = "Fail";
  testResult = QP_TEST_RESULT_FAIL;
  goto LAB_00d246c8;
}

Assistant:

tcu::TestNode::IterateResult GPUShader5PreciseQualifier::iterate(void)
{
	initTest();

	/* Set the seed for the random generator */
	randomSeed(1);

	glw::GLboolean test_failed = false;

	for (glw::GLuint test_iter = 0; test_iter < m_n_iterations; ++test_iter)
	{
		/* Create the data for positions and weights attributes */
		glw::GLfloat vertex_data_positions[m_n_components];
		glw::GLfloat vertex_data_weights[m_n_components];
		glw::GLfloat weights_sum = 1.0f;

		for (glw::GLuint component_nr = 0; component_nr < m_n_components; ++component_nr)
		{
			vertex_data_positions[component_nr] = static_cast<glw::GLfloat>(
				static_cast<glw::GLint>(randomFormula(2 * m_position_range)) - m_position_range);

			if (component_nr != (m_n_components - 1))
			{
				glw::GLfloat random_value = static_cast<glw::GLfloat>(randomFormula(m_position_range)) /
											static_cast<glw::GLfloat>(m_position_range);

				vertex_data_weights[component_nr] = random_value;
				weights_sum -= random_value;
			}
			else
			{
				vertex_data_weights[component_nr] = weights_sum;
			}
		}

		/* Compute forward weighted sum */
		WeightedSum weighted_sum_forward[m_n_components];

		drawAndGetFeedbackResult(vertex_data_positions, vertex_data_weights, weighted_sum_forward);

		/* Reverse the data for positions and weights attributes */
		glw::GLfloat temp_value = 0.0f;

		for (glw::GLuint component_nr = 0; component_nr < (m_n_components / 2); ++component_nr)
		{
			temp_value = vertex_data_positions[component_nr];

			vertex_data_positions[component_nr] = vertex_data_positions[m_n_components - 1 - component_nr];
			vertex_data_positions[m_n_components - 1 - component_nr] = temp_value;

			temp_value = vertex_data_weights[component_nr];

			vertex_data_weights[component_nr] = vertex_data_weights[m_n_components - 1 - component_nr];
			vertex_data_weights[m_n_components - 1 - component_nr] = temp_value;
		}

		/* Compute backward weighted sum */
		WeightedSum weighted_sum_backward[m_n_components];

		drawAndGetFeedbackResult(vertex_data_positions, vertex_data_weights, weighted_sum_backward);

		/* Check if results are bitwise accurate */
		if (weighted_sum_backward[0].intv != weighted_sum_backward[1].intv ||
			weighted_sum_backward[0].intv != weighted_sum_backward[2].intv ||
			weighted_sum_backward[0].intv != weighted_sum_forward[0].intv ||
			weighted_sum_backward[0].intv != weighted_sum_forward[1].intv ||
			weighted_sum_backward[0].intv != weighted_sum_forward[2].intv)
		{
			test_failed = true;
			break;
		}
	}

	if (test_failed)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}